

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void __thiscall kj::UnixEventPort::updateNextTimerEvent(UnixEventPort *this)

{
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *in_RSI;
  
  updateNextTimerEvent((UnixEventPort *)&this[-1].childSet.ptr.ptr,in_RSI);
  return;
}

Assistant:

void UnixEventPort::updateNextTimerEvent(kj::Maybe<TimePoint> time) {
  if (time == kj::none && !timerfdIsArmed) {
    // No change needed.
    return;
  }

  // Create the timerfd if needed.
  int tfd;
  KJ_IF_SOME(f, timerFd) {
    tfd = f;
  } else {
    tfd = timerFd.emplace(
        KJ_SYSCALL_FD(timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC | TFD_NONBLOCK)));

    struct epoll_event event;
    memset(&event, 0, sizeof(event));
    event.events = EPOLLIN;
    event.data.u64 = 1;
    KJ_SYSCALL(epoll_ctl(epollFd, EPOLL_CTL_ADD, tfd, &event));
  }